

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_avail_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  bool bVar4;
  ImGuiContext *pIVar5;
  ImGuiAxis IVar6;
  ImU32 col;
  ImU32 col_00;
  long lVar7;
  float *pfVar8;
  ImGuiCol idx;
  long lVar9;
  size_t idx_00;
  uint uVar10;
  float fVar11;
  int iVar12;
  undefined1 auVar13 [12];
  float fVar18;
  int iVar19;
  undefined1 auVar14 [16];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint in_XMM4_Db;
  uint in_XMM4_Dd;
  undefined1 auVar28 [16];
  undefined4 in_XMM5_Db;
  bool held;
  bool hovered;
  ImGuiAxis local_e0;
  float local_dc;
  ImRect local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  uint uStack_94;
  float fStack_90;
  uint uStack_8c;
  ImVec2 *local_80;
  undefined1 local_78 [16];
  float local_68;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar16 [16];
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar11 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar18 = (bb_frame->Max).y - (bb_frame->Min).y;
    held = false;
    if ((0.0 < fVar11) && (0.0 < fVar18)) {
      local_dc = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar24 = (GImGui->Style).FramePadding.y;
        fVar24 = fVar24 + fVar24;
        in_XMM4_Db = 0;
        in_XMM4_Dd = 0;
        if (fVar18 < fVar24 + GImGui->FontSize) {
          fVar24 = (fVar18 - GImGui->FontSize) / fVar24;
          if (fVar24 < 0.0) {
            return false;
          }
          local_dc = 1.0;
          if (fVar24 <= 1.0) {
            local_dc = fVar24;
          }
          if (local_dc <= 0.0) {
            return false;
          }
        }
      }
      iVar12 = (int)((fVar11 + -2.0) * 0.5);
      iVar19 = (int)((fVar18 + -2.0) * 0.5);
      auVar25._0_4_ = -(uint)(iVar12 < 0);
      auVar25._4_4_ = -(uint)(iVar19 < 0);
      auVar25._8_8_ = 0;
      auVar14._0_4_ = -(uint)(3 < iVar12);
      auVar14._4_4_ = -(uint)(3 < iVar19);
      auVar14._8_8_ = 0;
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = CONCAT44((float)iVar19,(float)iVar12) ^ 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26 = auVar25 & _DAT_001d8ef0 | ~auVar25 & (auVar14 & _DAT_001d8ee0 | ~auVar14 & auVar26);
      fStack_c0 = auVar26._0_4_;
      fVar18 = auVar26._4_4_;
      auVar20._0_8_ = auVar26._0_8_;
      auVar20._8_4_ = fStack_c0;
      auVar20._12_4_ = fVar18;
      local_d8.Min.x = (bb_frame->Min).x;
      local_d8.Min.y = (bb_frame->Min).y;
      local_d8.Max.x = (bb_frame->Max).x;
      local_d8.Max.y = (bb_frame->Max).y;
      local_c8 = local_d8.Min.x - fStack_c0;
      fVar11 = local_d8.Min.y - fVar18;
      fStack_c0 = local_d8.Max.x + fStack_c0;
      fStack_c4 = local_d8.Max.y + fVar18;
      auVar2._4_8_ = auVar20._8_8_;
      auVar2._0_4_ = local_d8.Min.y + fVar18;
      auVar21._0_8_ = auVar2._0_8_ << 0x20;
      auVar21._8_4_ = fStack_c0;
      auVar21._12_4_ = fStack_c4;
      local_d8.Max = auVar21._8_8_;
      local_d8.Min.y = fVar11;
      local_d8.Min.x = local_c8;
      if (axis != ImGuiAxis_X) {
        fStack_c0 = fStack_c4;
        local_c8 = fVar11;
      }
      local_c8 = fStack_c0 - local_c8;
      lVar9 = size_contents_v - size_avail_v;
      if (lVar9 == 0 || size_contents_v < size_avail_v) {
        size_contents_v = size_avail_v;
      }
      local_e0 = axis;
      if (size_contents_v < 1) {
        __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                      ,0x3b5,
                      "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, ImS64 *, ImS64, ImS64, ImDrawFlags)"
                     );
      }
      fVar24 = ((float)size_avail_v / (float)size_contents_v) * local_c8;
      fVar11 = (GImGui->Style).GrabMinSize;
      fVar18 = local_c8;
      if (fVar24 <= local_c8) {
        fVar18 = fVar24;
      }
      uVar10 = -(uint)(fVar24 < fVar11);
      uStack_94 = ~in_XMM4_Db & (uint)fStack_c4;
      uStack_8c = ~in_XMM4_Dd & (uint)fStack_c4;
      local_98 = (float)(uVar10 & (uint)fVar11 | ~uVar10 & (uint)fVar18);
      held = false;
      hovered = false;
      fStack_bc = fStack_c4;
      fStack_90 = fStack_c0;
      ButtonBehavior(&local_d8,id,&hovered,&held,0x40000);
      auVar3._8_4_ = fStack_c0;
      auVar3._0_8_ = CONCAT44(fStack_c4,local_c8);
      auVar3._12_4_ = fStack_bc;
      auVar28._4_4_ = uStack_94;
      auVar28._0_4_ = local_98;
      lVar7 = 1;
      if (1 < lVar9) {
        lVar7 = lVar9;
      }
      auVar28._8_4_ = uStack_94;
      auVar28._12_4_ = extraout_XMM0_Db;
      auVar27._8_8_ = auVar28._8_8_;
      auVar27._4_4_ = (float)*p_scroll_v;
      auVar27._0_4_ = local_98;
      auVar16._8_4_ = fStack_c4;
      auVar16._0_8_ = CONCAT44(fStack_c4,local_c8);
      auVar16._12_4_ = in_XMM5_Db;
      auVar15._8_8_ = auVar16._8_8_;
      auVar15._4_4_ = (float)lVar7;
      auVar15._0_4_ = local_c8;
      auVar26 = divps(auVar27,auVar15);
      fVar18 = auVar26._4_4_;
      iVar12 = -(uint)(auVar26._0_4_ < 1.0);
      iVar19 = -(uint)(fVar18 < 0.0);
      auVar23._4_4_ = iVar19;
      auVar23._0_4_ = iVar12;
      auVar23._8_4_ = iVar19;
      auVar23._12_4_ = iVar19;
      auVar22._8_8_ = auVar23._8_8_;
      auVar22._4_4_ = iVar12;
      auVar22._0_4_ = iVar12;
      uVar10 = movmskpd((int)lVar7,auVar22);
      fVar11 = 0.0;
      if (((uVar10 & 2) == 0) && (fVar11 = 1.0, fVar18 <= 1.0)) {
        fVar11 = fVar18;
      }
      local_80 = &bb_frame->Max;
      auVar17._4_12_ = auVar3._4_12_;
      auVar17._0_4_ = local_c8 - local_98;
      local_a8 = (fVar11 * auVar17._0_4_) / local_c8;
      uStack_a4 = 0;
      uStack_a0 = 0;
      uStack_9c = 0;
      if (((1.0 <= local_dc) && ((uVar10 & 1) != 0)) && (held != false)) {
        idx_00 = (size_t)local_e0;
        local_78 = auVar17;
        local_68 = (float)lVar7;
        local_58 = auVar26;
        pfVar8 = ImVec2::operator[](&local_d8.Min,idx_00);
        local_b8._0_4_ = *pfVar8;
        pfVar8 = ImVec2::operator[](&(pIVar5->IO).MousePos,idx_00);
        fVar11 = (*pfVar8 - (float)local_b8._0_4_) / local_c8;
        auVar13 = ZEXT812(0x3f800000);
        if (fVar11 <= 1.0) {
          auVar13._4_8_ = 0;
          auVar13._0_4_ = fVar11;
        }
        local_b8._4_4_ = 0;
        local_b8._0_4_ = ~-(uint)(fVar11 < 0.0) & auVar13._0_4_;
        local_b8._8_4_ = auVar13._8_4_;
        local_b8._12_4_ = 0;
        SetHoveredID(id);
        if (pIVar5->ActiveIdIsJustActivated == false) {
          fVar11 = pIVar5->ScrollbarClickDeltaToGrabCenter;
          bVar4 = false;
        }
        else if (((float)local_b8._0_4_ < local_a8) ||
                ((float)local_58._0_4_ + local_a8 < (float)local_b8._0_4_)) {
          pIVar5->ScrollbarClickDeltaToGrabCenter = 0.0;
          bVar4 = true;
          fVar11 = 0.0;
        }
        else {
          fVar11 = (float)local_58._0_4_ * -0.5 + ((float)local_b8._0_4_ - local_a8);
          pIVar5->ScrollbarClickDeltaToGrabCenter = fVar11;
          bVar4 = false;
        }
        fVar18 = ((float)local_58._0_4_ * -0.5 + ((float)local_b8._0_4_ - fVar11)) /
                 (1.0 - (float)local_58._0_4_);
        fVar11 = 1.0;
        if (fVar18 <= 1.0) {
          fVar11 = fVar18;
        }
        lVar9 = (long)((float)(~-(uint)(fVar18 < 0.0) & (uint)fVar11) * local_68);
        *p_scroll_v = lVar9;
        fVar18 = (float)lVar9 / local_68;
        fVar11 = 1.0;
        if (fVar18 <= 1.0) {
          fVar11 = fVar18;
        }
        local_a8 = ((float)local_78._0_4_ * (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar11)) /
                   local_c8;
        uStack_a4 = local_78._4_4_;
        uStack_a0 = local_78._8_4_;
        uStack_9c = local_78._12_4_;
        if (bVar4) {
          pIVar5->ScrollbarClickDeltaToGrabCenter =
               -(float)local_58._0_4_ * 0.5 + ((float)local_b8._0_4_ - local_a8);
        }
      }
      IVar6 = local_e0;
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (held == false) {
        idx = (hovered & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_dc);
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&bb_frame->Min,local_80,col,pIVar1->WindowRounding,flags);
      if (IVar6 == ImGuiAxis_X) {
        local_40.x = local_d8.Min.x + (local_d8.Max.x - local_d8.Min.x) * local_a8;
        local_38.x = local_98 + local_40.x;
        local_38.y = local_d8.Max.y;
        local_40.y = local_d8.Min.y;
      }
      else {
        local_40.y = (local_d8.Max.y - local_d8.Min.y) * local_a8 + local_d8.Min.y;
        local_38.y = local_98 + local_40.y;
        local_38.x = local_d8.Max.x;
        local_40.x = local_d8.Min.x;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_40,&local_38,col_00,(pIVar5->Style).ScrollbarRounding,0);
    }
  }
  else {
    held = false;
  }
  return held;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_avail_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_avail_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}